

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

bool __thiscall google::protobuf::io::Tokenizer::Next(Tokenizer *this)

{
  int iVar1;
  undefined1 uVar2;
  NextCommentStatus NVar3;
  char *__end;
  
  (this->previous_).type = (this->current_).type;
  std::__cxx11::string::_M_assign((string *)&(this->previous_).text);
  (this->previous_).end_column = (this->current_).end_column;
  iVar1 = (this->current_).column;
  (this->previous_).line = (this->current_).line;
  (this->previous_).column = iVar1;
  if (this->read_error_ != false) {
    (this->current_).type = TYPE_END;
    (this->current_).text._M_string_length = 0;
    *(this->current_).text._M_dataplus._M_p = '\0';
    iVar1 = this->column_;
    (this->current_).line = this->line_;
    (this->current_).column = iVar1;
    (this->current_).end_column = iVar1;
    return false;
  }
  while (((byte)this->current_char_ - 9 < 5 || (this->current_char_ == 0x20))) {
    NextChar(this);
  }
  NVar3 = TryConsumeCommentStart(this);
  uVar2 = (*(code *)(&DAT_00257bfc + *(int *)(&DAT_00257bfc + (ulong)NVar3 * 4)))();
  return (bool)uVar2;
}

Assistant:

bool Tokenizer::Next() {
  previous_ = current_;

  while (!read_error_) {
    ConsumeZeroOrMore<Whitespace>();

    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        ConsumeLineComment(NULL);
        continue;
      case BLOCK_COMMENT:
        ConsumeBlockComment(NULL);
        continue;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        break;
    }

    // Check for EOF before continuing.
    if (read_error_) break;

    if (LookingAt<Unprintable>() || current_char_ == '\0') {
      AddError("Invalid control characters encountered in text.");
      NextChar();
      // Skip more unprintable characters, too.  But, remember that '\0' is
      // also what current_char_ is set to after EOF / read error.  We have
      // to be careful not to go into an infinite loop of trying to consume
      // it, so make sure to check read_error_ explicitly before consuming
      // '\0'.
      while (TryConsumeOne<Unprintable>() ||
             (!read_error_ && TryConsume('\0'))) {
        // Ignore.
      }

    } else {
      // Reading some sort of token.
      StartToken();

      if (TryConsumeOne<Letter>()) {
        ConsumeZeroOrMore<Alphanumeric>();
        current_.type = TYPE_IDENTIFIER;
      } else if (TryConsume('0')) {
        current_.type = ConsumeNumber(true, false);
      } else if (TryConsume('.')) {
        // This could be the beginning of a floating-point number, or it could
        // just be a '.' symbol.

        if (TryConsumeOne<Digit>()) {
          // It's a floating-point number.
          if (previous_.type == TYPE_IDENTIFIER &&
              current_.line == previous_.line &&
              current_.column == previous_.end_column) {
            // We don't accept syntax like "blah.123".
            error_collector_->AddError(line_, column_ - 2,
              "Need space between identifier and decimal point.");
          }
          current_.type = ConsumeNumber(false, true);
        } else {
          current_.type = TYPE_SYMBOL;
        }
      } else if (TryConsumeOne<Digit>()) {
        current_.type = ConsumeNumber(false, false);
      } else if (TryConsume('\"')) {
        ConsumeString('\"');
        current_.type = TYPE_STRING;
      } else if (TryConsume('\'')) {
        ConsumeString('\'');
        current_.type = TYPE_STRING;
      } else {
        NextChar();
        current_.type = TYPE_SYMBOL;
      }

      EndToken();
      return true;
    }
  }

  // EOF
  current_.type = TYPE_END;
  current_.text.clear();
  current_.line = line_;
  current_.column = column_;
  current_.end_column = column_;
  return false;
}